

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

Result wabt::ResolveNamesModule(Module *module,Errors *errors)

{
  Result RVar1;
  undefined1 local_b8 [8];
  NameResolver resolver;
  Errors *errors_local;
  Module *module_local;
  
  resolver._144_8_ = errors;
  anon_unknown_13::NameResolver::NameResolver((NameResolver *)local_b8,(Script *)0x0,errors);
  RVar1 = anon_unknown_13::NameResolver::VisitModule((NameResolver *)local_b8,module);
  anon_unknown_13::NameResolver::~NameResolver((NameResolver *)local_b8);
  return (Result)RVar1.enum_;
}

Assistant:

Result ResolveNamesModule(Module* module, Errors* errors) {
  NameResolver resolver(nullptr, errors);
  return resolver.VisitModule(module);
}